

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall QtPrivate::QPodArrayOps<int>::erase(QPodArrayOps<int> *this,int *b,qsizetype n)

{
  int *__src;
  QArrayDataPointer<int> *pQVar1;
  int *piVar2;
  long in_RDX;
  QArrayDataPointer<int> *in_RSI;
  long in_RDI;
  int *e;
  QArrayDataPointer<int> *in_stack_ffffffffffffffb0;
  
  __src = (int *)((long)&in_RSI->d + in_RDX * 4);
  pQVar1 = (QArrayDataPointer<int> *)
           QArrayDataPointer<int>::begin((QArrayDataPointer<int> *)0x54e356);
  if ((in_RSI == pQVar1) &&
     (piVar2 = QArrayDataPointer<int>::end(in_stack_ffffffffffffffb0), __src != piVar2)) {
    *(int **)(in_RDI + 8) = __src;
  }
  else {
    piVar2 = QArrayDataPointer<int>::end(in_stack_ffffffffffffffb0);
    if (__src != piVar2) {
      piVar2 = QArrayDataPointer<int>::end(in_RSI);
      memmove(in_RSI,__src,((long)piVar2 - (long)__src >> 2) << 2);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }